

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O2

Voice * __thiscall Synthesizer::SynthesizerChannel::AllocateVoice(SynthesizerChannel *this,int key)

{
  Voice *pVVar1;
  Voice *pVVar2;
  int n;
  long lVar3;
  long lVar4;
  
  if (this->keys[key] != (Voice *)0x0) {
    return this->keys[key];
  }
  lVar3 = (long)this->numvoices;
  if (lVar3 < 0x20) {
    this->numvoices = this->numvoices + 1;
    pVVar2 = this->voicepool[lVar3];
  }
  else {
    pVVar2 = this->voicepool[0];
    for (lVar4 = 1; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      pVVar1 = this->voicepool[lVar4];
      if (pVVar2->aenv * pVVar2->fenv <= pVVar1->aenv * pVVar1->fenv) {
        pVVar1 = pVVar2;
      }
      pVVar2 = pVVar1;
    }
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
      if (this->keys[lVar3] == pVVar2) {
        this->keys[lVar3] = (Voice *)0x0;
      }
    }
  }
  this->keys[key] = pVVar2;
  return pVVar2;
}

Assistant:

Voice* AllocateVoice(int key)
        {
            Voice* v = keys[key];
            if (v != NULL)
                return v;

            if (numvoices < MAXVOICES)
                v = voicepool[numvoices++];
            else
            {
                v = voicepool[0];
                for (int i = 1; i < numvoices; i++)
                {
                    Voice* q = voicepool[i];
                    if (q->GetImportance() < v->GetImportance())
                        v = q;
                }
                for (int n = 0; n < 128; n++)
                    if (keys[n] == v)
                        keys[n] = NULL;
            }

            keys[key] = v;
            return v;
        }